

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O2

void __thiscall
OpenMD::LipidTransVisitor::LipidTransVisitor
          (LipidTransVisitor *this,SimInfo *info,string *originSeleScript,string *refSeleScript)

{
  SelectionEvaluator *this_00;
  SelectionManager *this_01;
  SelectionManager *this_02;
  int iVar1;
  StuntDouble *pSVar2;
  DirectionalAtom *pDVar3;
  SelectionEvaluator *this_03;
  int i;
  SelectionManager *local_38;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__LipidTransVisitor_002881e0;
  this->info_ = info;
  this_03 = &this->originEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_03,info);
  local_38 = &this->originSeleMan_;
  SelectionManager::SelectionManager(local_38,info);
  this_00 = &this->refEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->refSeleMan_;
  SelectionManager::SelectionManager(this_01,info);
  this->refSd_ = (StuntDouble *)0x0;
  SquareMatrix<double,_3>::SquareMatrix(&(this->rotMat_).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->origin_).super_Vector<double,_3U>);
  this_02 = local_38;
  std::__cxx11::string::assign((char *)&(this->super_BaseVisitor).visitorName);
  SelectionEvaluator::loadScriptString(this_03,originSeleScript);
  if ((this->originEvaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&i,this_03);
    SelectionManager::setSelectionSet(this_02,(SelectionSet *)&i);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&i);
    iVar1 = SelectionManager::getSelectionCount(this_02);
    if (iVar1 == 1) {
      pSVar2 = SelectionManager::beginSelected(this_02,&i);
      if (pSVar2 == (StuntDouble *)0x0) {
        this->originDatom_ = (DirectionalAtom *)0x0;
      }
      else {
        pDVar3 = (DirectionalAtom *)
                 __dynamic_cast(pSVar2,&StuntDouble::typeinfo,&DirectionalAtom::typeinfo,0);
        this->originDatom_ = pDVar3;
        if (pDVar3 != (DirectionalAtom *)0x0) goto LAB_001e454d;
      }
      memcpy(&painCave,"LipidTransVisitor: origin selection must select an directional atom",0x44);
      painCave.isFatal = 1;
      simError();
    }
    else {
      memcpy(&painCave,"LipidTransVisitor: origin selection must select an directional atom",0x44);
      painCave.isFatal = 1;
      simError();
    }
  }
LAB_001e454d:
  SelectionEvaluator::loadScriptString(this_00,refSeleScript);
  if ((this->refEvaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&i,this_00);
    SelectionManager::setSelectionSet(this_01,(SelectionSet *)&i);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&i);
    iVar1 = SelectionManager::getSelectionCount(this_01);
    if (iVar1 == 1) {
      pSVar2 = SelectionManager::beginSelected(this_01,&i);
      this->refSd_ = pSVar2;
    }
  }
  return;
}

Assistant:

LipidTransVisitor::LipidTransVisitor(SimInfo* info,
                                       const std::string& originSeleScript,
                                       const std::string& refSeleScript) :
      BaseVisitor(),
      info_(info), originEvaluator_(info), originSeleMan_(info),
      refEvaluator_(info), refSeleMan_(info), refSd_(NULL) {
    visitorName = "LipidTransVisitor";

    originEvaluator_.loadScriptString(originSeleScript);
    if (!originEvaluator_.isDynamic()) {
      originSeleMan_.setSelectionSet(originEvaluator_.evaluate());
      if (originSeleMan_.getSelectionCount() == 1) {
        int i;
        originDatom_ =
            dynamic_cast<DirectionalAtom*>(originSeleMan_.beginSelected(i));
        if (originDatom_ == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "LipidTransVisitor: origin selection must select an "
                   "directional atom");
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LipidTransVisitor: origin selection must select an directional "
            "atom");
        painCave.isFatal = 1;
        simError();
      }
    }

    refEvaluator_.loadScriptString(refSeleScript);
    if (!refEvaluator_.isDynamic()) {
      refSeleMan_.setSelectionSet(refEvaluator_.evaluate());
      if (refSeleMan_.getSelectionCount() == 1) {
        int i;
        refSd_ = refSeleMan_.beginSelected(i);

      } else {
        // error
      }
    }
  }